

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

boolean use_figurine(obj *obj)

{
  boolean bVar1;
  int iVar2;
  char *local_30;
  char *local_28;
  char local_1f;
  char local_1e;
  char local_1d;
  coord local_1c;
  char local_1a;
  char local_19;
  schar dz;
  schar dy;
  schar dx;
  coord cc;
  xchar y;
  obj *poStack_18;
  xchar x;
  obj *obj_local;
  
  poStack_18 = obj;
  if (((u._1052_1_ & 1) == 0) ||
     (bVar1 = figurine_location_checks(obj,(coord *)0x0,'\0'), bVar1 != '\0')) {
    iVar2 = getdir((char *)0x0,&local_1d,&local_1e,&local_1f);
    if (iVar2 == 0) {
      multi = 0;
      flags.move = '\0';
      obj_local._7_1_ = '\0';
    }
    else {
      local_1c.x = u.ux + local_1d;
      local_1c.y = u.uy + local_1e;
      local_1a = local_1c.y;
      local_19 = local_1c.x;
      bVar1 = figurine_location_checks(poStack_18,&local_1c,'\0');
      if (bVar1 == '\0') {
        obj_local._7_1_ = '\0';
      }
      else {
        if ((local_1d == '\0') && (local_1e == '\0')) {
          bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
          if (((bVar1 == '\0') &&
              (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) &&
             (bVar1 = is_pool(level,(int)local_1c.x,(int)local_1c.y), bVar1 == '\0')) {
            local_30 = "set the figurine on the ground";
            if (local_1f < '\0') {
              local_30 = "toss the figurine into the air";
            }
          }
          else {
            local_30 = "release the figurine";
          }
          local_28 = local_30;
        }
        else {
          local_28 = "set the figurine beside you";
        }
        pline("You %s and it transforms.",local_28);
        make_familiar(poStack_18,local_1c.x,local_1c.y,'\0');
        stop_timer(poStack_18->olev,5,poStack_18);
        useup(poStack_18);
        obj_local._7_1_ = '\x01';
      }
    }
  }
  else {
    obj_local._7_1_ = '\0';
  }
  return obj_local._7_1_;
}

Assistant:

static boolean use_figurine(struct obj *obj)
{
	xchar x, y;
	coord cc;
	schar dx, dy, dz;

	if (u.uswallow) {
		/* can't activate a figurine while swallowed */
		if (!figurine_location_checks(obj, NULL, FALSE))
			return FALSE;
	}
	if (!getdir(NULL, &dx, &dy, &dz)) {
		flags.move = multi = 0;
		return FALSE;
	}
	
	x = u.ux + dx;
	y = u.uy + dy;
	cc.x = x;
	cc.y = y;
	
	/* Passing FALSE arg here will result in messages displayed */
	if (!figurine_location_checks(obj, &cc, FALSE))
	    return FALSE;
	pline("You %s and it transforms.",
	    (dx || dy) ? "set the figurine beside you" :
	    (Is_airlevel(&u.uz) || Is_waterlevel(&u.uz) ||
	     is_pool(level, cc.x, cc.y)) ?
		"release the figurine" :
	    (dz < 0 ?
		"toss the figurine into the air" :
		"set the figurine on the ground"));
	make_familiar(obj, cc.x, cc.y, FALSE);
	stop_timer(obj->olev, FIG_TRANSFORM, obj);
	useup(obj);
	
	return TRUE;
}